

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSphereSphereCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtSphereSphereCollisionAlgorithm::processCollision
          (cbtSphereSphereCollisionAlgorithm *this,cbtCollisionObjectWrapper *col0Wrap,
          cbtCollisionObjectWrapper *col1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  float fVar1;
  cbtCollisionShape *pcVar2;
  cbtTransform *pcVar3;
  cbtCollisionShape *pcVar4;
  cbtTransform *pcVar5;
  cbtPersistentManifold *this_00;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  int iVar11;
  cbtManifoldPoint *pt;
  long lVar12;
  float fVar13;
  float fVar14;
  cbtVector3 normalOnSurfaceB;
  cbtVector3 pos1;
  undefined1 local_48 [8];
  float fStack_40;
  undefined1 local_38 [16];
  
  if (this->m_manifoldPtr != (cbtPersistentManifold *)0x0) {
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    pcVar2 = col0Wrap->m_shape;
    pcVar3 = col0Wrap->m_worldTransform;
    pcVar4 = col1Wrap->m_shape;
    pcVar5 = col1Wrap->m_worldTransform;
    fVar7 = (pcVar3->m_origin).m_floats[0] - (pcVar5->m_origin).m_floats[0];
    fVar8 = (pcVar3->m_origin).m_floats[1] - (pcVar5->m_origin).m_floats[1];
    fVar9 = (pcVar3->m_origin).m_floats[2] - (pcVar5->m_origin).m_floats[2];
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar8)),ZEXT416((uint)fVar7),
                              ZEXT416((uint)fVar7));
    auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
    if (auVar10._0_4_ < 0.0) {
      fVar13 = sqrtf(auVar10._0_4_);
    }
    else {
      auVar10 = vsqrtss_avx(auVar10,auVar10);
      fVar13 = auVar10._0_4_;
    }
    fVar1 = *(float *)&pcVar2[1].field_0xc;
    fVar14 = *(float *)&pcVar2->field_0x1c;
    fVar6 = *(float *)&pcVar4[1].field_0xc * *(float *)&pcVar4->field_0x1c;
    this_00 = this->m_manifoldPtr;
    iVar11 = this_00->m_cachedPoints;
    if (0 < iVar11) {
      pt = this_00->m_pointCache;
      lVar12 = 0;
      do {
        cbtPersistentManifold::clearUserCache(this_00,pt);
        lVar12 = lVar12 + 1;
        iVar11 = this_00->m_cachedPoints;
        pt = pt + 1;
      } while (lVar12 < iVar11);
    }
    if (iVar11 != 0 && gContactEndedCallback != (ContactEndedCallback)0x0) {
      local_48 = (undefined1  [8])this_00;
      (*gContactEndedCallback)((cbtPersistentManifold **)local_48);
    }
    this_00->m_cachedPoints = 0;
    fVar1 = fVar6 + fVar1 * fVar14;
    if (fVar13 <= fVar1 + resultOut->m_closestPointDistanceThreshold) {
      _local_48 = SUB6416(ZEXT464(0x3f800000),0);
      if (1.1920929e-07 < fVar13) {
        fVar14 = 1.0 / fVar13;
        auVar10 = vinsertps_avx(ZEXT416((uint)(fVar14 * fVar7)),ZEXT416((uint)(fVar14 * fVar8)),0x10
                               );
        _local_48 = vinsertps_avx(auVar10,ZEXT416((uint)(fVar14 * fVar9)),0x28);
      }
      pcVar3 = col1Wrap->m_worldTransform;
      auVar10 = vinsertps_avx(ZEXT416((uint)(fVar6 * (float)local_48._0_4_ +
                                            (pcVar3->m_origin).m_floats[0])),
                              ZEXT416((uint)(fVar6 * (float)local_48._4_4_ +
                                            (pcVar3->m_origin).m_floats[1])),0x10);
      local_38 = vinsertps_avx(auVar10,ZEXT416((uint)(fVar6 * fStack_40 +
                                                     (pcVar3->m_origin).m_floats[2])),0x28);
      (*(resultOut->super_Result)._vptr_Result[4])((ulong)(uint)(fVar13 - fVar1),resultOut);
    }
  }
  return;
}

Assistant:

void cbtSphereSphereCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* col0Wrap, const cbtCollisionObjectWrapper* col1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	(void)dispatchInfo;

	if (!m_manifoldPtr)
		return;

	resultOut->setPersistentManifold(m_manifoldPtr);

	cbtSphereShape* sphere0 = (cbtSphereShape*)col0Wrap->getCollisionShape();
	cbtSphereShape* sphere1 = (cbtSphereShape*)col1Wrap->getCollisionShape();

	cbtVector3 diff = col0Wrap->getWorldTransform().getOrigin() - col1Wrap->getWorldTransform().getOrigin();
	cbtScalar len = diff.length();
	cbtScalar radius0 = sphere0->getRadius();
	cbtScalar radius1 = sphere1->getRadius();

#ifdef CLEAR_MANIFOLD
	m_manifoldPtr->clearManifold();  //don't do this, it disables warmstarting
#endif

	///iff distance positive, don't generate a new contact
	if (len > (radius0 + radius1 + resultOut->m_closestPointDistanceThreshold))
	{
#ifndef CLEAR_MANIFOLD
		resultOut->refreshContactPoints();
#endif  //CLEAR_MANIFOLD
		return;
	}
	///distance (negative means penetration)
	cbtScalar dist = len - (radius0 + radius1);

	cbtVector3 normalOnSurfaceB(1, 0, 0);
	if (len > SIMD_EPSILON)
	{
		normalOnSurfaceB = diff / len;
	}

	///point on A (worldspace)
	///cbtVector3 pos0 = col0->getWorldTransform().getOrigin() - radius0 * normalOnSurfaceB;
	///point on B (worldspace)
	cbtVector3 pos1 = col1Wrap->getWorldTransform().getOrigin() + radius1 * normalOnSurfaceB;

	/// report a contact. internally this will be kept persistent, and contact reduction is done

	resultOut->addContactPoint(normalOnSurfaceB, pos1, dist);

#ifndef CLEAR_MANIFOLD
	resultOut->refreshContactPoints();
#endif  //CLEAR_MANIFOLD
}